

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

Table * luaH_new(lua_State *L)

{
  GCObject *pGVar1;
  
  pGVar1 = luaC_newobj(L,5,0x38,(GCObject **)0x0,0);
  (pGVar1->h).metatable = (Table *)0x0;
  *(lu_byte *)((long)pGVar1 + 10) = 0xff;
  *(lu_byte *)((long)pGVar1 + 0xb) = '\0';
  (pGVar1->h).array = (TValue *)0x0;
  (pGVar1->h).sizearray = 0;
  (pGVar1->h).node = &dummynode_;
  (pGVar1->h).lastfree = &dummynode_;
  return (Table *)pGVar1;
}

Assistant:

Table *luaH_new (lua_State *L) {
  Table *t = &luaC_newobj(L, LUA_TTABLE, sizeof(Table), NULL, 0)->h;
  t->metatable = NULL;
  t->flags = cast_byte(~0);
  t->array = NULL;
  t->sizearray = 0;
  setnodevector(L, t, 0);
  return t;
}